

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O2

void duckdb_aggregate_function_set_extra_info
               (duckdb_aggregate_function function,void *extra_info,duckdb_delete_callback_t destroy
               )

{
  AggregateFunctionInfo *pAVar1;
  
  if (extra_info != (void *)0x0 && function != (duckdb_aggregate_function)0x0) {
    pAVar1 = duckdb::shared_ptr<duckdb::AggregateFunctionInfo,_true>::operator->
                       ((shared_ptr<duckdb::AggregateFunctionInfo,_true> *)(function + 0x120));
    pAVar1[7]._vptr_AggregateFunctionInfo = (_func_int **)extra_info;
    pAVar1[8]._vptr_AggregateFunctionInfo = (_func_int **)destroy;
  }
  return;
}

Assistant:

void duckdb_aggregate_function_set_extra_info(duckdb_aggregate_function function, void *extra_info,
                                              duckdb_delete_callback_t destroy) {
	if (!function || !extra_info) {
		return;
	}
	auto &aggregate_function = GetCAggregateFunction(function);
	auto &function_info = aggregate_function.function_info->Cast<duckdb::CAggregateFunctionInfo>();
	function_info.extra_info = static_cast<duckdb_function_info>(extra_info);
	function_info.delete_callback = destroy;
}